

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstring_stage9.h
# Opt level: O0

string * __thiscall pstring::str_abi_cxx11_(string *__return_storage_ptr__,pstring *this)

{
  ulong uVar1;
  char *pcVar2;
  allocator local_19;
  pstring *local_18;
  pstring *this_local;
  
  uVar1 = this->m_length_;
  pcVar2 = this->m_buffer_;
  local_18 = this;
  this_local = (pstring *)__return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,uVar1,&local_19);
  std::allocator<char>::~allocator((allocator<char> *)&local_19);
  return __return_storage_ptr__;
}

Assistant:

std::string str() const
        // For sanity checks only.
    {
        return { m_buffer_, m_length_ };
    }